

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O3

void __thiscall QPDF_Array::QPDF_Array(QPDF_Array *this,QPDF_Array *other)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var2;
  
  _Var1._M_head_impl =
       (other->sp)._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Sparse *)0x0) {
    _Var2._M_head_impl = (Sparse *)0x0;
  }
  else {
    _Var2._M_head_impl = (Sparse *)operator_new(0x38);
    (_Var2._M_head_impl)->size = (_Var1._M_head_impl)->size;
    std::
    _Rb_tree<int,_std::pair<const_int,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_int,_QPDFObjectHandle>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
    ::_Rb_tree(&((_Var2._M_head_impl)->elements)._M_t,&((_Var1._M_head_impl)->elements)._M_t);
  }
  (this->sp)._M_t.
  super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
  super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl = _Var2._M_head_impl;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements).super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

QPDF_Array(QPDF_Array const& other) :
        sp(other.sp ? std::make_unique<Sparse>(*other.sp) : nullptr)
    {
    }